

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

void testing::internal::ReportFailureInUnknownLocation(Type result_type,String *message)

{
  String local_28;
  
  UnitTest::GetInstance();
  local_28.c_str_ = (char *)0x0;
  local_28.length_ = 0;
  UnitTest::AddTestPartResult
            (&UnitTest::GetInstance::instance,result_type,(char *)0x0,-1,message,&local_28);
  if (local_28.c_str_ != (char *)0x0) {
    operator_delete__(local_28.c_str_);
    return;
  }
  return;
}

Assistant:

void ReportFailureInUnknownLocation(TestPartResult::Type result_type,
                                    const String& message) {
  // This function is a friend of UnitTest and as such has access to
  // AddTestPartResult.
  UnitTest::GetInstance()->AddTestPartResult(
      result_type,
      NULL,  // No info about the source file where the exception occurred.
      -1,    // We have no info on which line caused the exception.
      message,
      String());  // No stack trace, either.
}